

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

MetricInfo __thiscall
xLearn::Trainer::calc_metric
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader_list)

{
  MetricInfo MVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  vector<float,_std::allocator<float>_> *this_00;
  vector<float,_std::allocator<float>_> *pvVar5;
  reference ppRVar6;
  size_type sVar7;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_RSI;
  long in_RDI;
  index_t tmp;
  int i;
  vector<float,_std::allocator<float>_> pred;
  DMatrix *matrix;
  MetricInfo info;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffee0;
  string *in_stack_ffffffffffffff38;
  allocator *paVar8;
  allocator *file;
  LogSeverity severity;
  int local_a4;
  vector<float,_std::allocator<float>_> local_a0;
  long local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *local_18;
  real_t local_8;
  real_t rStack_4;
  
  local_18 = in_RSI;
  bVar2 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                    (in_stack_fffffffffffffed0);
  if (!bVar2) {
    local_88 = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x225bc3);
    if (*(long *)(in_RDI + 0x38) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x18))();
    }
    (**(code **)(**(long **)(in_RDI + 0x30) + 0x38))();
    local_a4 = 0;
    while( true ) {
      this_00 = (vector<float,_std::allocator<float>_> *)(long)local_a4;
      pvVar5 = (vector<float,_std::allocator<float>_> *)
               std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(local_18);
      if (pvVar5 <= this_00) break;
      ppRVar6 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                          (local_18,(long)local_a4);
      (*(*ppRVar6)->_vptr_Reader[5])();
      while( true ) {
        ppRVar6 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                            (local_18,(long)local_a4);
        uVar3 = (*(*ppRVar6)->_vptr_Reader[4])(*ppRVar6,&local_88);
        if (uVar3 == 0) break;
        sVar7 = std::vector<float,_std::allocator<float>_>::size(&local_a0);
        if (uVar3 != sVar7) {
          std::vector<float,_std::allocator<float>_>::resize
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        }
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x18))
                  (*(long **)(in_RDI + 0x30),local_88,*(undefined8 *)(in_RDI + 0x28),&local_a0);
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))
                  (*(long **)(in_RDI + 0x30),&local_a0,local_88 + 0x30);
        if (*(long *)(in_RDI + 0x38) != 0) {
          (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))
                    (*(long **)(in_RDI + 0x38),local_88 + 0x30,&local_a0);
        }
      }
      local_a4 = local_a4 + 1;
    }
    local_8 = (real_t)(**(code **)(**(long **)(in_RDI + 0x30) + 0x30))();
    if (*(long *)(in_RDI + 0x38) != 0) {
      rStack_4 = (real_t)(**(code **)(**(long **)(in_RDI + 0x38) + 0x20))();
    }
    std::vector<float,_std::allocator<float>_>::~vector(this_00);
    MVar1.metric_val = rStack_4;
    MVar1.loss_val = local_8;
    return MVar1;
  }
  Logger::Logger(&local_1c,ERR);
  severity = (LogSeverity)((ulong)in_RDI >> 0x20);
  file = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.cc"
             ,file);
  paVar8 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"calc_metric",paVar8);
  poVar4 = Logger::Start(severity,(string *)file,(int)((ulong)paVar8 >> 0x20),
                         in_stack_ffffffffffffff38);
  poVar4 = std::operator<<(poVar4,"CHECK_NE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.cc"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x10e);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"reader_list.empty()");
  poVar4 = std::operator<<(poVar4," = ");
  bVar2 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                    (in_stack_fffffffffffffed0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar2);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"true");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  Logger::~Logger((Logger *)in_stack_fffffffffffffed0);
  abort();
}

Assistant:

MetricInfo Trainer::calc_metric(std::vector<Reader*>& reader_list) {
  CHECK_NE(reader_list.empty(), true);
  DMatrix* matrix = nullptr;
  std::vector<real_t> pred;
  if (metric_ != nullptr) {
    metric_->Reset();
  }
  loss_->Reset();
  for (int i = 0; i < reader_list.size(); ++i) {
    reader_list[i]->Reset();
    for (;;) {
      index_t tmp = reader_list[i]->Samples(matrix);
      if (tmp == 0) { break; }
      if (tmp != pred.size()) { pred.resize(tmp); }
      loss_->Predict(matrix, *model_, pred);
      loss_->Evaluate(pred, matrix->Y);
      if (metric_ != nullptr) {
        metric_->Accumulate(matrix->Y, pred);
      }
    }
  }
  MetricInfo info;
  info.loss_val = loss_->GetLoss();
  if (metric_ != nullptr) {
    info.metric_val = metric_->GetMetric();
  }
  return info;
}